

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::GetCorrelation
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *correlation)

{
  bool bVar1;
  long in_RDX;
  Buffer *in_RDI;
  SymmetricMatrix *in_stack_00000048;
  Buffer *in_stack_00000050;
  StatisticsAccumulation *in_stack_00000058;
  int j;
  int i;
  double *sigma;
  vector<double,_std::allocator<double>_> standard_deviation;
  int in_stack_ffffffffffffff3c;
  Row *in_stack_ffffffffffffff40;
  SymmetricMatrix *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  StatisticsAccumulation *in_stack_ffffffffffffff78;
  Row local_70;
  int local_58;
  int local_54;
  reference local_50;
  undefined4 local_48;
  vector<double,_std::allocator<double>_> local_38 [2];
  byte local_1;
  
  if ((((((ulong)(in_RDI->first_order_statistics_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start & 0x10000) == 0) || (*(int *)&in_RDI->field_0xc < 2)) ||
      (((ulong)(in_RDI->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start & 1) != 0)) || (in_RDX == 0)) {
    local_1 = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x108a73);
    bVar1 = GetStandardDeviation
                      (in_stack_ffffffffffffff78,in_RDI,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (bVar1) {
      bVar1 = GetFullCovariance(in_stack_00000058,in_stack_00000050,in_stack_00000048);
      if (bVar1) {
        local_50 = std::vector<double,_std::allocator<double>_>::operator[](local_38,0);
        for (local_54 = 0; local_54 <= in_RDI->zeroth_order_statistics_; local_54 = local_54 + 1) {
          for (local_58 = 0; local_58 <= local_54; local_58 = local_58 + 1) {
            SymmetricMatrix::operator[]
                      (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
            in_stack_ffffffffffffff50 =
                 (vector<double,_std::allocator<double>_> *)
                 SymmetricMatrix::Row::operator[]
                           (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
            in_stack_ffffffffffffff48 =
                 (SymmetricMatrix *)
                 ((double)(in_stack_ffffffffffffff50->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start /
                 (local_50[local_54] * local_50[local_58]));
            SymmetricMatrix::operator[]
                      (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
            in_stack_ffffffffffffff40 =
                 (Row *)SymmetricMatrix::Row::operator[]
                                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
            in_stack_ffffffffffffff40->_vptr_Row = (_func_int **)in_stack_ffffffffffffff48;
            SymmetricMatrix::Row::~Row((Row *)&stack0xffffffffffffff78);
            SymmetricMatrix::Row::~Row(&local_70);
          }
        }
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
    local_48 = 1;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff50);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool StatisticsAccumulation::GetCorrelation(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* correlation) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      NULL == correlation) {
    return false;
  }

  std::vector<double> standard_deviation;
  if (!GetStandardDeviation(buffer, &standard_deviation)) {
    return false;
  }
  if (!GetFullCovariance(buffer, correlation)) {
    return false;
  }

  const double* sigma(&(standard_deviation[0]));
  for (int i(0); i <= num_order_; ++i) {
    for (int j(0); j <= i; ++j) {
      (*correlation)[i][j] = (*correlation)[i][j] / (sigma[i] * sigma[j]);
    }
  }

  return true;
}